

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O0

int coda_type_vsf_integer_set_type(coda_type_special *type,coda_type *base_type)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  coda_type_record_field *field_00;
  coda_type_record_field *field;
  coda_type *base_type_local;
  coda_type_special *type_local;
  
  if (type->format == base_type->format) {
    if (type->base_type[1].name == (char *)0x1) {
      field_00 = coda_type_record_field_new("value");
      if (field_00 == (coda_type_record_field *)0x0) {
        type_local._4_4_ = -1;
      }
      else {
        iVar1 = coda_type_record_field_set_type(field_00,base_type);
        if (iVar1 == 0) {
          iVar1 = coda_type_record_add_field((coda_type_record *)type->base_type,field_00);
          if (iVar1 == 0) {
            type->bit_size = type->base_type->bit_size;
            type_local._4_4_ = 0;
          }
          else {
            coda_type_record_field_delete(field_00);
            type_local._4_4_ = -1;
          }
        }
        else {
          coda_type_record_field_delete(field_00);
          type_local._4_4_ = -1;
        }
      }
    }
    else {
      coda_set_error(-400,"value should be second field of a vsf integer record");
      type_local._4_4_ = -1;
    }
  }
  else {
    pcVar2 = coda_type_get_format_name(base_type->format);
    pcVar3 = coda_type_get_format_name(type->format);
    coda_set_error(-400,"cannot use element type with %s format for vsf integer with %s format",
                   pcVar2,pcVar3);
    type_local._4_4_ = -1;
  }
  return type_local._4_4_;
}

Assistant:

int coda_type_vsf_integer_set_type(coda_type_special *type, coda_type *base_type)
{
    coda_type_record_field *field;

    if (type->format != base_type->format)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION,
                       "cannot use element type with %s format for vsf integer with %s format",
                       coda_type_get_format_name(base_type->format), coda_type_get_format_name(type->format));
        return -1;
    }
    if (((coda_type_record *)type->base_type)->num_fields != 1)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "value should be second field of a vsf integer record");
        return -1;
    }

    field = coda_type_record_field_new("value");
    if (field == NULL)
    {
        return -1;
    }
    if (coda_type_record_field_set_type(field, base_type) != 0)
    {
        coda_type_record_field_delete(field);
        return -1;
    }
    if (coda_type_record_add_field((coda_type_record *)type->base_type, field) != 0)
    {
        coda_type_record_field_delete(field);
        return -1;
    }
    /* update bit_size */
    type->bit_size = type->base_type->bit_size;
    return 0;
}